

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> __thiscall
duckdb::LocalFileSystem::OpenFile
          (LocalFileSystem *this,string *path_p,FileOpenFlags flags,
          optional_ptr<duckdb::FileOpener,_true> opener)

{
  int __val;
  size_type sVar1;
  size_type sVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  FileType FVar6;
  int iVar7;
  __pid_t _Var8;
  __uid_t __uid;
  char *pcVar9;
  FileOpener *opener_00;
  Logger *this_00;
  int *piVar10;
  NotImplementedException *this_01;
  InternalException *this_02;
  IOException *pIVar11;
  pointer pFVar12;
  ssize_t sVar13;
  passwd *ppVar14;
  uint uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  uint uVar16;
  undefined8 uVar17;
  uint uVar18;
  string *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  optional_ptr<duckdb::FileOpener,_true> in_R9;
  char cVar19;
  allocator local_12d7;
  allocator local_12d6;
  allocator local_12d5;
  int fd;
  string *local_12d0;
  string proc_exe_link;
  string local_12a8;
  string process_owner;
  string extended_error;
  string local_1248;
  string process_name;
  optional_ptr<duckdb::FileOpener,_true> opener_local;
  FileOpenFlags flags_local;
  string local_11d8;
  string local_11b8;
  string path;
  string local_1178;
  ulong local_1158 [3];
  ulong uStack_1140;
  string local_1138;
  string local_1118 [32];
  string local_10f8;
  string local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1098;
  string local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  string cmdline;
  undefined1 local_ff8 [4040];
  
  flags_local.flags = flags._8_8_;
  local_12d0 = path_p;
  flags_local._8_8_ = opener.ptr;
  FileSystem::ExpandPath(&path,(string *)flags.flags,in_R9);
  pcVar9 = NormalizeLocalPath(&path);
  if (((uint)opener.ptr & 0xff00) != 0x100) {
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&cmdline,"Unsupported compression type for default file system",
               (allocator *)&process_name);
    NotImplementedException::NotImplementedException(this_01,&cmdline);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (in_R9.ptr != (FileOpener *)0x0) {
    opener_00 = optional_ptr<duckdb::FileOpener,_true>::operator*(&opener_local);
    this_00 = Logger::Get(opener_00);
    iVar4 = (*this_00->_vptr_Logger[2])(this_00,"duckdb.FileSystem.LocalFileSystem.OpenFile",0x1e);
    if ((char)iVar4 != '\0') {
      Logger::WriteLog(this_00,"duckdb.FileSystem.LocalFileSystem.OpenFile",LOG_INFO,
                       (string *)flags.flags);
    }
  }
  uVar18 = flags._8_4_;
  uVar5 = 1;
  if (((undefined1  [16])flags & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar5 = (uint)((uVar18 & 3) == 3) * 2;
  }
  if (((undefined1  [16])flags & (undefined1  [16])0x3) == (undefined1  [16])0x0) {
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&cmdline,"READ, WRITE or both should be specified when opening a file",
               (allocator *)&process_name);
    InternalException::InternalException(this_02,&cmdline);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (((undefined1  [16])flags & (undefined1  [16])0x2) != (undefined1  [16])0x0) {
    uVar16 = 0x80240;
    if (((undefined1  [16])flags & (undefined1  [16])0x10) == (undefined1  [16])0x0) {
      uVar16 = 0x80000;
    }
    uVar15 = 0x80040;
    if (((undefined1  [16])flags & (undefined1  [16])0x8) == (undefined1  [16])0x0) {
      uVar15 = uVar16;
    }
    uVar5 = uVar5 | (uVar18 & 0x20) << 5 | uVar15;
  }
  uVar5 = (uVar18 & 4) << 0xc | uVar5;
  uVar17 = 0x180;
  if (((undefined1  [16])flags & (undefined1  [16])0x40) == (undefined1  [16])0x0) {
    uVar17 = 0x1b6;
  }
  uVar16 = uVar5 | 0x80;
  if (((undefined1  [16])flags & (undefined1  [16])0x240) == (undefined1  [16])0x0) {
    uVar16 = uVar5;
  }
  iVar4 = open(pcVar9,uVar16,uVar17);
  fd = iVar4;
  if (iVar4 != -1) {
    cVar19 = (char)opener.ptr;
    if (cVar19 != '\0') {
      FVar6 = GetFileTypeInternal(iVar4);
      if (FVar6 - FILE_TYPE_LINK < 0xfffffffe) {
        uStack_1140 = 0;
        local_1158[0] = (ulong)(cVar19 != '\x01');
        local_1158[1] = 0;
        local_1158[2] = 0;
        iVar7 = fcntl(iVar4,6);
        piVar10 = __errno_location();
        __val = *piVar10;
        extended_error._M_dataplus._M_p = (pointer)&extended_error.field_2;
        extended_error._M_string_length = 0;
        extended_error.field_2._M_local_buf[0] = '\0';
        if (__val == 0x5f && iVar7 == -1) {
          if (cVar19 != '\x01') {
            ::std::__cxx11::string::assign((char *)&extended_error);
            if (extended_error._M_string_length != 0) goto LAB_017b973e;
LAB_017b9682:
            iVar7 = fcntl(iVar4,5,local_1158);
            uVar3 = uStack_1140;
            if (iVar7 == -1) {
              strerror(*piVar10);
              ::std::__cxx11::string::assign((char *)&extended_error);
            }
            else {
              iVar7 = (int)uStack_1140;
              _Var8 = getpid();
              if (_Var8 == iVar7) {
                ::std::__cxx11::string::string
                          ((string *)&local_1078,
                           "Lock is already held in current process, likely another DuckDB instance"
                           ,(allocator *)&cmdline);
              }
              else {
                process_name._M_dataplus._M_p = (pointer)&process_name.field_2;
                process_name._M_string_length = 0;
                process_name.field_2._M_local_buf[0] = '\0';
                process_owner._M_dataplus._M_p = (pointer)&process_owner.field_2;
                process_owner._M_string_length = 0;
                process_owner.field_2._M_local_buf[0] = '\0';
                ::std::__cxx11::string::string
                          ((string *)&local_1248,"/proc/%d/cmdline",(allocator *)&local_11b8);
                Exception::ConstructMessage<int>((string *)&cmdline,&local_1248,iVar7);
                (**(code **)((local_12d0->_M_dataplus)._M_p + 0x10))
                          (&proc_exe_link,local_12d0,&cmdline,1,0x100,0);
                ::std::__cxx11::string::~string((string *)&cmdline);
                ::std::__cxx11::string::~string((string *)&local_1248);
                pFVar12 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                          ::operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                                        *)&proc_exe_link);
                FileHandle::ReadLine_abi_cxx11_(&cmdline,pFVar12);
                __xpg_basename(cmdline._M_dataplus._M_p);
                ::std::__cxx11::string::assign((char *)&process_name);
                ::std::__cxx11::string::~string((string *)&cmdline);
                if (proc_exe_link._M_dataplus._M_p != (pointer)0x0) {
                  (**(code **)(*(long *)proc_exe_link._M_dataplus._M_p + 8))();
                }
                switchD_016d8eb1::default(&cmdline,0,0x1000);
                ::std::__cxx11::string::string
                          ((string *)&local_11b8,"/proc/%d/exe",(allocator *)&local_12a8);
                Exception::ConstructMessage<int>((string *)&proc_exe_link,&local_11b8,iVar7);
                ::std::__cxx11::string::~string((string *)&local_11b8);
                sVar13 = readlink(proc_exe_link._M_dataplus._M_p,(char *)&cmdline,0x1000);
                if (0 < sVar13) {
                  ::std::__cxx11::string::assign((char *)&process_name);
                }
                ::std::__cxx11::string::~string((string *)&proc_exe_link);
                ::std::__cxx11::string::string
                          ((string *)&proc_exe_link,"/proc/%d/loginuid",(allocator *)&local_11d8);
                Exception::ConstructMessage<int>((string *)&cmdline,(string *)&proc_exe_link,iVar7);
                params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
                params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x100;
                (**(code **)((local_12d0->_M_dataplus)._M_p + 0x10))
                          (&local_12a8,local_12d0,&cmdline,1,0x100,0);
                ::std::__cxx11::string::~string((string *)&cmdline);
                ::std::__cxx11::string::~string((string *)&proc_exe_link);
                pFVar12 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                          ::operator->((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                                        *)&local_12a8);
                FileHandle::ReadLine_abi_cxx11_(&cmdline,pFVar12);
                __uid = ::std::__cxx11::stoi((string *)&cmdline,(size_t *)0x0,10);
                ::std::__cxx11::string::~string((string *)&cmdline);
                ppVar14 = getpwuid(__uid);
                if (ppVar14 != (passwd *)0x0) {
                  ::std::__cxx11::string::assign((char *)&process_owner);
                }
                if ((long *)local_12a8._M_dataplus._M_p != (long *)0x0) {
                  (**(code **)(*(long *)local_12a8._M_dataplus._M_p + 8))();
                }
                ::std::__cxx11::string::string
                          ((string *)&cmdline,"Conflicting lock is held in %s%s",&local_12d5);
                sVar2 = process_name._M_string_length;
                if (process_name._M_string_length == 0) {
                  ::std::__cxx11::string::string((string *)&local_10f8,"PID %d",&local_12d6);
                  Exception::ConstructMessage<int>(&local_12a8,&local_10f8,iVar7);
                }
                else {
                  ::std::__cxx11::string::string((string *)&local_11d8,"%s (PID %d)",&local_12d6);
                  ::std::__cxx11::string::string((string *)&local_10d8,(string *)&process_name);
                  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (uVar3 & 0xffffffff);
                  StringUtil::Format<std::__cxx11::string,int>
                            ((string *)&local_12a8,(StringUtil *)&local_11d8,&local_10d8,params,
                             (int)params_1);
                }
                sVar1 = process_owner._M_string_length;
                if (process_owner._M_string_length == 0) {
                  ::std::__cxx11::string::string
                            ((string *)&local_1178,anon_var_dwarf_3b6586a + 9,&local_12d7);
                }
                else {
                  ::std::__cxx11::string::string(local_1118," by user %s",&local_12d7);
                  ::std::__cxx11::string::string((string *)&local_1138,(string *)&process_owner);
                  StringUtil::Format<std::__cxx11::string>
                            (&local_1178,(StringUtil *)local_1118,&local_1138,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             params);
                }
                StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                          (&local_1078,(StringUtil *)&cmdline,&local_12a8,&local_1178,params_1);
                ::std::__cxx11::string::~string((string *)&local_1178);
                if (sVar1 != 0) {
                  ::std::__cxx11::string::~string((string *)&local_1138);
                  ::std::__cxx11::string::~string(local_1118);
                }
                ::std::__cxx11::string::~string((string *)&local_12a8);
                if (sVar2 == 0) {
                  this_03 = &local_10f8;
                }
                else {
                  ::std::__cxx11::string::~string((string *)&local_10d8);
                  this_03 = &local_11d8;
                }
                ::std::__cxx11::string::~string((string *)this_03);
                ::std::__cxx11::string::~string((string *)&cmdline);
                ::std::__cxx11::string::~string((string *)&process_owner);
                ::std::__cxx11::string::~string((string *)&process_name);
                opener.ptr = (FileOpener *)(flags_local._8_8_ & 0xff);
                iVar4 = fd;
              }
              ::std::__cxx11::string::operator=((string *)&extended_error,(string *)&local_1078);
              ::std::__cxx11::string::~string((string *)&local_1078);
            }
            if ((char)opener.ptr == '\x02') {
              local_1158[0] = local_1158[0] & 0xffffffffffff0000;
              iVar7 = fcntl(iVar4,6);
              if (iVar7 != -1) {
                ::std::__cxx11::string::append((char *)&extended_error);
              }
            }
LAB_017b973e:
            iVar4 = close(iVar4);
            if (iVar4 == -1) {
              ::std::__cxx11::string::append((char *)&extended_error);
            }
            ::std::__cxx11::string::append((char *)&extended_error);
            pIVar11 = (IOException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&process_owner,"Could not set lock on file \"%s\": %s",
                       (allocator *)&proc_exe_link);
            ::std::__cxx11::to_string(&local_1248,__val);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&cmdline,(char (*) [6])"errno",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1248);
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&process_name,&cmdline,local_ff8,0,&local_11b8,&local_12a8,&local_11d8);
            ::std::__cxx11::string::string((string *)&local_1098,(string *)&path);
            ::std::__cxx11::string::string((string *)&local_10b8,(string *)&extended_error);
            IOException::IOException<std::__cxx11::string,std::__cxx11::string>
                      (pIVar11,&process_owner,
                       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&process_name,&local_1098,&local_10b8);
            __cxa_throw(pIVar11,&IOException::typeinfo,::std::runtime_error::~runtime_error);
          }
          *piVar10 = 0;
        }
        else if (iVar7 == -1) goto LAB_017b9682;
        ::std::__cxx11::string::~string((string *)&extended_error);
      }
    }
    make_uniq<duckdb::UnixFileHandle,duckdb::LocalFileSystem&,std::__cxx11::string&,int&,duckdb::FileOpenFlags&>
              ((duckdb *)&cmdline,(LocalFileSystem *)local_12d0,&path,&fd,&flags_local);
    (this->super_FileSystem)._vptr_FileSystem = (_func_int **)cmdline._M_dataplus._M_p;
    goto LAB_017b94a6;
  }
  if ((char)flags.lock < '\0') {
    piVar10 = __errno_location();
    if (*piVar10 != 2) goto LAB_017b943d;
  }
  else {
LAB_017b943d:
    if ((uVar18 >> 10 & 1) == 0) {
LAB_017b9576:
      pIVar11 = (IOException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&process_owner,"Cannot open file \"%s\": %s",(allocator *)&proc_exe_link)
      ;
      piVar10 = __errno_location();
      ::std::__cxx11::to_string(&local_1248,*piVar10);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&cmdline,(char (*) [6])"errno",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1248);
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&process_name,&cmdline,local_ff8,0,&local_11b8,&local_12a8,&local_11d8);
      ::std::__cxx11::string::string((string *)&local_1058,(string *)&path);
      pcVar9 = strerror(*piVar10);
      IOException::IOException<std::__cxx11::string,char*>
                (pIVar11,&process_owner,
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&process_name,&local_1058,pcVar9);
      __cxa_throw(pIVar11,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    piVar10 = __errno_location();
    if (*piVar10 != 0x11) goto LAB_017b9576;
  }
  (this->super_FileSystem)._vptr_FileSystem = (_func_int **)0x0;
LAB_017b94a6:
  ::std::__cxx11::string::~string((string *)&path);
  return (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)this;
}

Assistant:

unique_ptr<FileHandle> LocalFileSystem::OpenFile(const string &path_p, FileOpenFlags flags,
                                                 optional_ptr<FileOpener> opener) {
	auto path = FileSystem::ExpandPath(path_p, opener);
	auto normalized_path = NormalizeLocalPath(path);
	if (flags.Compression() != FileCompressionType::UNCOMPRESSED) {
		throw NotImplementedException("Unsupported compression type for default file system");
	}

	if (opener) {
		DUCKDB_LOG_INFO(*opener, "duckdb.FileSystem.LocalFileSystem.OpenFile", path_p);
	}

	flags.Verify();

	int open_flags = 0;
	int rc;
	bool open_read = flags.OpenForReading();
	bool open_write = flags.OpenForWriting();
	if (open_read && open_write) {
		open_flags = O_RDWR;
	} else if (open_read) {
		open_flags = O_RDONLY;
	} else if (open_write) {
		open_flags = O_WRONLY;
	} else {
		throw InternalException("READ, WRITE or both should be specified when opening a file");
	}
	if (open_write) {
		// need Read or Write
		D_ASSERT(flags.OpenForWriting());
		open_flags |= O_CLOEXEC;
		if (flags.CreateFileIfNotExists()) {
			open_flags |= O_CREAT;
		} else if (flags.OverwriteExistingFile()) {
			open_flags |= O_CREAT | O_TRUNC;
		}
		if (flags.OpenForAppending()) {
			open_flags |= O_APPEND;
		}
	}
	if (flags.DirectIO()) {
#if defined(__sun) && defined(__SVR4)
		throw InvalidInputException("DIRECT_IO not supported on Solaris");
#endif
#if defined(__DARWIN__) || defined(__APPLE__) || defined(__OpenBSD__)
		// OSX does not have O_DIRECT, instead we need to use fcntl afterwards to support direct IO
#else
		open_flags |= O_DIRECT;
#endif
	}

	// Determine permissions
	mode_t filesec;
	if (flags.CreatePrivateFile()) {
		open_flags |= O_EXCL; // Ensure we error on existing files or the permissions may not set
		filesec = 0600;
	} else {
		filesec = 0666;
	}

	if (flags.ExclusiveCreate()) {
		open_flags |= O_EXCL;
	}

	// Open the file
	int fd = open(normalized_path, open_flags, filesec);

	if (fd == -1) {
		if (flags.ReturnNullIfNotExists() && errno == ENOENT) {
			return nullptr;
		}
		if (flags.ReturnNullIfExists() && errno == EEXIST) {
			return nullptr;
		}
		throw IOException("Cannot open file \"%s\": %s", {{"errno", std::to_string(errno)}}, path, strerror(errno));
	}

#if defined(__DARWIN__) || defined(__APPLE__)
	if (flags.DirectIO()) {
		// OSX requires fcntl for Direct IO
		rc = fcntl(fd, F_NOCACHE, 1);
		if (rc == -1) {
			throw IOException("Could not enable direct IO for file \"%s\": %s", path, strerror(errno));
		}
	}
#endif

	if (flags.Lock() != FileLockType::NO_LOCK) {
		// set lock on file
		// but only if it is not an input/output stream
		auto file_type = GetFileTypeInternal(fd);
		if (file_type != FileType::FILE_TYPE_FIFO && file_type != FileType::FILE_TYPE_SOCKET) {
			struct flock fl;
			memset(&fl, 0, sizeof fl);
			fl.l_type = flags.Lock() == FileLockType::READ_LOCK ? F_RDLCK : F_WRLCK;
			fl.l_whence = SEEK_SET;
			fl.l_start = 0;
			fl.l_len = 0;
			rc = fcntl(fd, F_SETLK, &fl);
			// Retain the original error.
			int retained_errno = errno;
			bool has_error = rc == -1;
			string extended_error;
			if (has_error) {
				if (retained_errno == ENOTSUP) {
					// file lock not supported for this file system
					if (flags.Lock() == FileLockType::READ_LOCK) {
						// for read-only, we ignore not-supported errors
						has_error = false;
						errno = 0;
					} else {
						extended_error = "File locks are not supported for this file system, cannot open the file in "
						                 "read-write mode. Try opening the file in read-only mode";
					}
				}
			}
			if (has_error) {
				if (extended_error.empty()) {
					// try to find out who is holding the lock using F_GETLK
					rc = fcntl(fd, F_GETLK, &fl);
					if (rc == -1) { // fnctl does not want to help us
						extended_error = strerror(errno);
					} else {
						extended_error = AdditionalProcessInfo(*this, fl.l_pid);
					}
					if (flags.Lock() == FileLockType::WRITE_LOCK) {
						// maybe we can get a read lock instead and tell this to the user.
						fl.l_type = F_RDLCK;
						rc = fcntl(fd, F_SETLK, &fl);
						if (rc != -1) { // success!
							extended_error +=
							    ". However, you would be able to open this database in read-only mode, e.g. by "
							    "using the -readonly parameter in the CLI";
						}
					}
				}
				rc = close(fd);
				if (rc == -1) {
					extended_error += ". Also, failed closing file";
				}
				extended_error += ". See also https://duckdb.org/docs/stable/connect/concurrency";
				throw IOException("Could not set lock on file \"%s\": %s", {{"errno", std::to_string(retained_errno)}},
				                  path, extended_error);
			}
		}
	}
	return make_uniq<UnixFileHandle>(*this, path, fd, flags);
}